

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

bool __thiscall ON_DimStyleExtra::Read(ON_DimStyleExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_DimStyleExtra *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::BeginRead3dmChunk
                       (archive,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if (iStack_1c != 1) {
    local_21 = false;
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_parent_dimstyle);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_valid_fields);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_tolerance_style);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_tolerance_resolution);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_tolerance_upper_value);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_tolerance_lower_value);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_tolerance_height_scale);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_baseline_spacing);
  }
  if (0 < local_20) {
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bDrawMask);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_mask_color_source);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadColor(_minor_version,&this->m_mask_color);
    }
  }
  if (1 < local_20) {
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_dimscale);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_dimscale_source);
    }
  }
  if ((2 < local_20) && (local_21 != false)) {
    local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_source_dimstyle);
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool ON_DimStyleExtra::Read(ON_BinaryArchive& archive)
{
  // Changed to 1,0 for mask settings 12/12/09
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(major_version != 1)
    rc = false;

  if(rc) rc = archive.ReadUuid(m_parent_dimstyle);
  if(rc) rc = archive.ReadArray(m_valid_fields);

  if(rc) rc = archive.ReadInt(&m_tolerance_style);
  if(rc) rc = archive.ReadInt(&m_tolerance_resolution);

  if(rc) rc = archive.ReadDouble(&m_tolerance_upper_value);
  if(rc) rc = archive.ReadDouble(&m_tolerance_lower_value);
  if(rc) rc = archive.ReadDouble(&m_tolerance_height_scale);

  if(rc) rc = archive.ReadDouble(&m_baseline_spacing);

  if(minor_version >= 1)
  {
    if(rc) rc = archive.ReadBool(&m_bDrawMask);
    if(rc) rc = archive.ReadInt(&m_mask_color_source);
    if(rc) rc = archive.ReadColor(m_mask_color);
  }

  if(minor_version >= 2)
  {
    if(rc) rc = archive.ReadDouble(&m_dimscale);
    if(rc) rc = archive.ReadInt(&m_dimscale_source);
  }

  if(minor_version >= 3)
  {
    if(rc) rc = archive.ReadUuid(m_source_dimstyle);
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}